

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

void string_feeder_require(string_feeder_t *sf,char *str)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x224,"void string_feeder_require(string_feeder_t *, const char *)");
  }
  if (str != (char *)0x0) {
    if (sf->len < sf->pos) {
      __assert_fail("sf->pos <= sf->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                    ,0x226,"void string_feeder_require(string_feeder_t *, const char *)");
    }
    sVar2 = strlen(str);
    if (sVar2 != 0) {
      sVar3 = 0;
      do {
        cVar1 = string_feeder_next(sf);
        if (cVar1 != str[sVar3]) {
          __assert_fail("c == str[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                        ,0x22c,"void string_feeder_require(string_feeder_t *, const char *)");
        }
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    return;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x225,"void string_feeder_require(string_feeder_t *, const char *)");
}

Assistant:

void string_feeder_require(string_feeder_t *sf, const char *str)
{
    assert(sf != NULL);
    assert(str != NULL);
    assert(sf->pos <= sf->len);

    size_t len = strlen(str);

    for (int i = 0; i < len; i++) {
        char c = string_feeder_next(sf);
        assert(c == str[i]);
    }
}